

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

VkResult shim_vkGetSwapchainImagesKHR
                   (VkDevice device,VkSwapchainKHR swapchain,uint32_t *pSwapchainImageCount,
                   VkImage *pSwapchainImages)

{
  VkResult VVar1;
  initializer_list<VkImage_T_*> __l;
  allocator_type local_49;
  VkImage_T *local_48;
  undefined8 local_40;
  undefined8 local_38;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> images;
  
  local_48 = (VkImage_T *)0xedd0;
  local_40 = 0xedd1;
  local_38 = 0xedd1;
  __l._M_len = 3;
  __l._M_array = &local_48;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)
             &images.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>,__l,&local_49);
  VVar1 = fill_out_count_pointer_pair<VkImage_T*>
                    ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)
                     &images.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>,
                     pSwapchainImageCount,pSwapchainImages);
  std::_Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~_Vector_base
            (&images.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>);
  return VVar1;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkGetSwapchainImagesKHR(
    [[maybe_unused]] VkDevice device, [[maybe_unused]] VkSwapchainKHR swapchain, uint32_t* pSwapchainImageCount, VkImage* pSwapchainImages) {

    std::vector<VkImage> images{ get_uint64_handle<VkImage>(0x0000EDD0U),
        get_uint64_handle<VkImage>(0x0000EDD1U),
        get_uint64_handle<VkImage>(0x0000EDD1U) };
    return fill_out_count_pointer_pair(images, pSwapchainImageCount, pSwapchainImages);
}